

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_mediator.hpp
# Opt level: O2

bool __thiscall iutest::TestInfo::Mediator::HasNonfatalFailure(Mediator *this)

{
  bool bVar1;
  
  bVar1 = TestResult::HasNonfatalFailure
                    (&((this->super_iuITestInfoMediator).m_test_info)->m_test_result);
  return bVar1;
}

Assistant:

TestInfo* ptr() const IUTEST_CXX_NOEXCEPT_SPEC { return m_test_info; }